

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
* __thiscall
fmt::v5::internal::
arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
::find(basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
       *__return_storage_ptr__,
      arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
      *this,basic_string_view<wchar_t> name)

{
  uint uVar1;
  entry *peVar2;
  undefined4 uVar3;
  bool bVar4;
  entry *end;
  entry *it;
  arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *this_local;
  basic_string_view<wchar_t> name_local;
  
  end = this->map_;
  peVar2 = this->map_;
  uVar1 = this->size_;
  while( true ) {
    if (end == peVar2 + uVar1) {
      basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
      ::basic_format_arg(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    bVar4 = v5::operator==(end->name,name);
    if (bVar4) break;
    end = end + 1;
  }
  (__return_storage_ptr__->value_).field_0.long_long_value =
       (end->arg).value_.field_0.long_long_value;
  (__return_storage_ptr__->value_).field_0.string.size = (end->arg).value_.field_0.string.size;
  uVar3 = *(undefined4 *)&(end->arg).field_0x14;
  __return_storage_ptr__->type_ = (end->arg).type_;
  *(undefined4 *)&__return_storage_ptr__->field_0x14 = uVar3;
  *(undefined8 *)&__return_storage_ptr__->field_0x18 = *(undefined8 *)&(end->arg).field_0x18;
  return __return_storage_ptr__;
}

Assistant:

basic_format_arg<Context> find(basic_string_view<char_type> name) const {
    // The list is unsorted, so just return the first matching name.
    for (entry *it = map_, *end = map_ + size_; it != end; ++it) {
      if (it->name == name)
        return it->arg;
    }
    return {};
  }